

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall QList<SafeSymbols>::takeLast(QList<SafeSymbols> *this)

{
  QArrayDataPointer<SafeSymbols> *in_RSI;
  SafeSymbols *in_RDI;
  value_type *v;
  SafeSymbols *in_stack_ffffffffffffffc8;
  
  memset(in_RDI,0xaa,0x40);
  last((QList<SafeSymbols> *)in_stack_ffffffffffffffc8);
  SafeSymbols::SafeSymbols(in_RDI,in_stack_ffffffffffffffc8);
  QArrayDataPointer<SafeSymbols>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<SafeSymbols>::eraseLast((QGenericArrayOps<SafeSymbols> *)in_RDI);
  return in_RDI;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }